

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O2

off_t file_stdio_fsize(ALLEGRO_FILE *f)

{
  _Bool _Var1;
  int64_t offset;
  int64_t iVar2;
  int64_t iVar3;
  
  offset = file_stdio_ftell(f);
  iVar3 = -1;
  if (offset != -1) {
    _Var1 = file_stdio_fseek(f,0,2);
    if (_Var1) {
      iVar2 = file_stdio_ftell(f);
      if (iVar2 != -1) {
        _Var1 = file_stdio_fseek(f,offset,0);
        iVar3 = -1;
        if (_Var1) {
          iVar3 = iVar2;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static off_t file_stdio_fsize(ALLEGRO_FILE *f)
{
   int64_t old_pos;
   int64_t new_pos;

   old_pos = file_stdio_ftell(f);
   if (old_pos == -1)
      return -1;

   if (!file_stdio_fseek(f, 0, ALLEGRO_SEEK_END))
      return -1;

   new_pos = file_stdio_ftell(f);
   if (new_pos == -1)
      return -1;

   if (!file_stdio_fseek(f, old_pos, ALLEGRO_SEEK_SET))
      return -1;

   return new_pos;
}